

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subtypes.h
# Opt level: O3

vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> * __thiscall
wasm::SubTypes::getSubTypesFirstSort
          (vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *__return_storage_ptr__,
          SubTypes *this)

{
  pointer pHVar1;
  undefined8 *puVar2;
  undefined8 uVar3;
  HeapType HVar4;
  const_iterator cVar5;
  undefined8 *puVar6;
  undefined8 *puVar7;
  pointer pHVar8;
  key_type local_78;
  HeapType type;
  undefined1 auStack_68 [8];
  vector<std::pair<wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_std::allocator<std::pair<wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>_>
  graph;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> local_48;
  
  auStack_68 = (undefined1  [8])0x0;
  graph.
  super__Vector_base<std::pair<wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_std::allocator<std::pair<wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  graph.
  super__Vector_base<std::pair<wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_std::allocator<std::pair<wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  std::
  vector<std::pair<wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_std::allocator<std::pair<wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>_>
  ::reserve((vector<std::pair<wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_std::allocator<std::pair<wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>_>
             *)auStack_68,
            (long)(this->types).super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)(this->types).super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                  _M_impl.super__Vector_impl_data._M_start >> 3);
  pHVar8 = (this->types).super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl
           .super__Vector_impl_data._M_start;
  pHVar1 = (this->types).super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl
           .super__Vector_impl_data._M_finish;
  type.id = (uintptr_t)__return_storage_ptr__;
  if (pHVar8 != pHVar1) {
    do {
      local_78.id = pHVar8->id;
      cVar5 = std::
              _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_std::allocator<std::pair<const_wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::find(&(this->typeSubTypes)._M_h,&local_78);
      if (cVar5.
          super__Node_iterator_base<std::pair<const_wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_true>
          ._M_cur == (__node_type *)0x0) {
        local_48.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_48.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_48.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        std::
        vector<std::pair<wasm::HeapType,std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>>,std::allocator<std::pair<wasm::HeapType,std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>>>>
        ::emplace_back<wasm::HeapType&,std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>>
                  ((vector<std::pair<wasm::HeapType,std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>>,std::allocator<std::pair<wasm::HeapType,std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>>>>
                    *)auStack_68,&local_78,&local_48);
        if (local_48.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_48.
                          super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                          _M_impl.super__Vector_impl_data._M_start,
                          (long)local_48.
                                super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_48.
                                super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
      }
      else {
        std::
        vector<std::pair<wasm::HeapType,std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>>,std::allocator<std::pair<wasm::HeapType,std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>>>>
        ::
        emplace_back<std::pair<wasm::HeapType_const,std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>>const&>
                  ((vector<std::pair<wasm::HeapType,std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>>,std::allocator<std::pair<wasm::HeapType,std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>>>>
                    *)auStack_68,
                   (pair<const_wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>
                    *)((long)cVar5.
                             super__Node_iterator_base<std::pair<const_wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_true>
                             ._M_cur + 8));
      }
      pHVar8 = pHVar8 + 1;
    } while (pHVar8 != pHVar1);
  }
  HVar4.id = type.id;
  TopologicalSort::
  sortOfImpl<__gnu_cxx::__normal_iterator<std::pair<wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_*,_std::vector<std::pair<wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_std::allocator<std::pair<wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>_>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_(&)(const_std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_&),_wasm::TopologicalSort::sort>
            ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)type.id,
             (__normal_iterator<std::pair<wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_*,_std::vector<std::pair<wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_std::allocator<std::pair<wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>_>_>
              )auStack_68,
             (__normal_iterator<std::pair<wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_*,_std::vector<std::pair<wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_std::allocator<std::pair<wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>_>_>
              )graph.
               super__Vector_base<std::pair<wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_std::allocator<std::pair<wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start);
  puVar2 = *(undefined8 **)HVar4.id;
  puVar7 = *(undefined8 **)(HVar4.id + 8) + -1;
  if (puVar2 < puVar7 && puVar2 != *(undefined8 **)(HVar4.id + 8)) {
    do {
      puVar6 = puVar2 + 1;
      uVar3 = *puVar2;
      *puVar2 = *puVar7;
      *puVar7 = uVar3;
      puVar7 = puVar7 + -1;
      puVar2 = puVar6;
    } while (puVar6 < puVar7);
  }
  std::
  vector<std::pair<wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_std::allocator<std::pair<wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>_>
  ::~vector((vector<std::pair<wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_std::allocator<std::pair<wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>_>
             *)auStack_68);
  return (vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)HVar4.id;
}

Assistant:

std::vector<HeapType> getSubTypesFirstSort() const {
    std::vector<std::pair<HeapType, std::vector<HeapType>>> graph;
    graph.reserve(types.size());
    for (auto type : types) {
      if (auto it = typeSubTypes.find(type); it != typeSubTypes.end()) {
        graph.emplace_back(*it);
      } else {
        graph.emplace_back(type, std::vector<HeapType>{});
      }
    }
    auto sorted = TopologicalSort::sortOf(graph.begin(), graph.end());
    std::reverse(sorted.begin(), sorted.end());
    return sorted;
  }